

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O3

ImgClass * __thiscall Webcam::getImg(ImgClass *__return_storage_ptr__,Webcam *this)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  uchar *__dest;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&imgLock);
  if (iVar1 == 0) {
    sVar3 = jpgClean(imgBuffer[readyImgPos].data,(long)imgBuffer[readyImgPos].size);
    imgBuffer[readyImgPos].size = (int)sVar3;
    lVar4 = (long)readyImgPos;
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    __return_storage_ptr__->size = 0;
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    (__return_storage_ptr__->name)._M_string_length = 0;
    (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
    iVar1 = imgBuffer[lVar4].size;
    iVar2 = -1;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    __dest = (uchar *)operator_new__((long)iVar2);
    __return_storage_ptr__->data = __dest;
    memcpy(__dest,imgBuffer[lVar4].data,(long)iVar1);
    iVar2 = imgBuffer[lVar4].height;
    __return_storage_ptr__->width = imgBuffer[lVar4].width;
    __return_storage_ptr__->height = iVar2;
    __return_storage_ptr__->size = iVar1;
    pthread_mutex_unlock((pthread_mutex_t *)&imgLock);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

ImgClass Webcam::getImg()
{
#ifdef USE_WEBCAM_DEBUG
    cout<<"Webcam::getImg"<<endl;
    cout<<"imgBuffer[readyImgPos].size = "<<imgBuffer[readyImgPos].size<<endl;
#endif
    imgLock.lock();
    imgBuffer[readyImgPos].size = jpgClean(imgBuffer[readyImgPos].data, imgBuffer[readyImgPos].size);
    auto img = ImgClass(imgBuffer[readyImgPos]);
    imgLock.unlock();
    return img;
}